

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O1

ggml_backend_buffer *
ggml_backend_alloc_ctx_tensors_from_buft(ggml_context *ctx,ggml_backend_buffer_type_t buft)

{
  bool bVar1;
  ggml_tensor *pgVar2;
  _Bool _Var3;
  size_t sVar4;
  ggml_tensor *tensor;
  size_t sVar5;
  ggml_backend_buffer_t pgVar6;
  ulong size;
  ggml_tensor *t;
  ulong uVar7;
  bool bVar8;
  ggml_backend_buffer_t *buffers;
  size_t n_buffers;
  ggml_backend_buffer_t *local_68;
  ggml_tensor *local_60;
  ggml_backend_buffer_type_t local_58;
  size_t local_50;
  long local_48;
  size_t local_40;
  ulong local_38;
  
  _Var3 = ggml_get_no_alloc(ctx);
  if (!_Var3) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
               ,0x3d9,"GGML_ASSERT(%s) failed","ggml_get_no_alloc(ctx) == true");
  }
  sVar4 = ggml_backend_buft_get_alignment(buft);
  local_58 = buft;
  local_40 = ggml_backend_buft_get_max_size(buft);
  size = 0;
  local_68 = (ggml_backend_buffer_t *)0x0;
  local_50 = 0;
  tensor = ggml_get_first_tensor(ctx);
  bVar8 = tensor == (ggml_tensor *)0x0;
  local_60 = tensor;
  if (!bVar8) {
    local_48 = sVar4 - 1;
    local_38 = -sVar4;
    sVar4 = 0;
    do {
      uVar7 = local_38;
      if ((tensor->data == (void *)0x0) && (tensor->view_src == (ggml_tensor *)0x0)) {
        sVar5 = ggml_backend_buft_get_alloc_size(local_58,tensor);
        uVar7 = sVar5 + local_48 & uVar7;
      }
      else {
        uVar7 = 0;
      }
      size = uVar7 + sVar4;
      bVar1 = true;
      pgVar2 = local_60;
      if (((sVar4 != 0) && (local_40 < size)) &&
         (_Var3 = alloc_tensor_range(ctx,local_60,tensor,local_58,sVar4,&local_68,&local_50),
         size = uVar7, pgVar2 = tensor, !_Var3)) {
        bVar1 = false;
        size = sVar4;
        pgVar2 = local_60;
      }
      local_60 = pgVar2;
      if (!bVar1) break;
      tensor = ggml_get_next_tensor(ctx,tensor);
      bVar8 = tensor == (ggml_tensor *)0x0;
      sVar4 = size;
    } while (!bVar8);
  }
  if (bVar8) {
    if ((size != 0) &&
       (_Var3 = alloc_tensor_range(ctx,local_60,(ggml_tensor *)0x0,local_58,size,&local_68,&local_50
                                  ), !_Var3)) {
      return (ggml_backend_buffer *)0x0;
    }
    if (local_50 != 0) {
      if (local_50 == 1) {
        pgVar6 = *local_68;
      }
      else {
        pgVar6 = ggml_backend_multi_buffer_alloc_buffer(local_68,local_50);
      }
      free(local_68);
      return pgVar6;
    }
  }
  return (ggml_backend_buffer *)0x0;
}

Assistant:

ggml_backend_buffer_t ggml_backend_alloc_ctx_tensors_from_buft(struct ggml_context * ctx, ggml_backend_buffer_type_t buft) {
    GGML_ASSERT(ggml_get_no_alloc(ctx) == true);

    size_t alignment = ggml_backend_buft_get_alignment(buft);
    size_t max_size = ggml_backend_buft_get_max_size(buft);

    ggml_backend_buffer_t * buffers = NULL;
    size_t n_buffers = 0;

    size_t cur_buf_size = 0;
    struct ggml_tensor * first = ggml_get_first_tensor(ctx);
    for (struct ggml_tensor * t = first; t != NULL; t = ggml_get_next_tensor(ctx, t)) {
        size_t this_size = 0;
        if (t->data == NULL && t->view_src == NULL) {
            this_size = GGML_PAD(ggml_backend_buft_get_alloc_size(buft, t), alignment);
        }

        if (cur_buf_size > 0 && (cur_buf_size + this_size) > max_size) {
            // allocate tensors in the current buffer
            if (!alloc_tensor_range(ctx, first, t, buft, cur_buf_size, &buffers, &n_buffers)) {
                return NULL;
            }
            first = t;
            cur_buf_size = this_size;
        } else {
            cur_buf_size += this_size;
        }
    }

    // allocate remaining tensors
    if (cur_buf_size > 0) {
        if (!alloc_tensor_range(ctx, first, NULL, buft, cur_buf_size, &buffers, &n_buffers)) {
            return NULL;
        }
    }

    if (n_buffers == 0) {
#ifndef NDEBUG
        GGML_LOG_DEBUG("%s: all tensors in the context are already allocated\n", __func__);
#endif
        return NULL;
    }

    ggml_backend_buffer_t buffer;
    if (n_buffers == 1) {
        buffer = buffers[0];
    } else {
        buffer = ggml_backend_multi_buffer_alloc_buffer(buffers, n_buffers);
    }
    free(buffers);
    return buffer;
}